

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int jump_statement(void)

{
  int iVar1;
  int extraout_EAX;
  node_t pvVar2;
  socklen_t *in_RDX;
  sockaddr *in_RSI;
  int unaff_retaddr;
  node_t n;
  node_t in_stack_ffffffffffffffe8;
  undefined4 local_4;
  int id;
  
  iVar1 = accept(0x83,in_RSI,in_RDX);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pvVar2 = expression();
    id = (int)((ulong)pvVar2 >> 0x20);
    iVar1 = expect(unaff_retaddr);
    if (iVar1 == 0) {
      sync();
      local_4 = extraout_EAX;
    }
    else {
      jump(id,in_stack_ffffffffffffffe8);
      ast_add_node((node_t)0x1062ac);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int jump_statement()
{
    node_t n = NULL;
    if (accept(RETURN))
    {
        n = expression();
        TODO("Check return type ?");
        if (expect(';'))
        {
            ast_add_node(jump(RETURN, n));
            return 1;
        }
        else
            return sync(";");
    }
    return 0;
}